

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp.c
# Opt level: O1

LispPTR N_OP_ftimes2(LispPTR parg1,LispPTR parg2)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  uint uVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  
  uVar1 = (ulong)parg2;
  uVar2 = (ulong)parg1;
  if ((parg1 & 0xfff0000) == 0xf0000) {
    fVar7 = (float)(int)(parg1 | 0xffff0000);
  }
  else if ((parg1 & 0xfff0000) == 0xe0000) {
    fVar7 = (float)(parg1 & 0xffff);
  }
  else {
    uVar3 = *(ushort *)((ulong)(parg1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar3 == 2) {
      if ((parg1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      fVar7 = (float)*(int *)(Lisp_world + uVar2);
    }
    else {
      if (uVar3 != 3) {
        MachineState.tosvalue = parg2;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if ((parg1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      fVar7 = *(float *)(Lisp_world + uVar2);
    }
  }
  if ((parg2 & 0xfff0000) == 0xf0000) {
    uVar4 = parg2 | 0xffff0000;
  }
  else {
    if ((parg2 & 0xfff0000) != 0xe0000) {
      uVar3 = *(ushort *)((ulong)(parg2 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
      if (uVar3 == 2) {
        if ((parg2 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
        }
        fVar6 = (float)*(int *)(Lisp_world + uVar1);
      }
      else {
        if (uVar3 != 3) {
          MachineState.tosvalue = parg2;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((parg2 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
        }
        fVar6 = *(float *)(Lisp_world + uVar1);
      }
      goto LAB_00121a1b;
    }
    uVar4 = parg2 & 0xffff;
  }
  fVar6 = (float)(int)uVar4;
LAB_00121a1b:
  if (0x7f7fffff < (uint)ABS(fVar7 * fVar6)) {
    MachineState.errorexit = 1;
    MachineState.tosvalue = parg2;
    return 0xffffffff;
  }
  pfVar5 = (float *)createcell68k(3);
  *pfVar5 = fVar7 * fVar6;
  if (((ulong)pfVar5 & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",pfVar5);
  }
  return (LispPTR)((ulong)((long)pfVar5 - (long)Lisp_world) >> 1);
}

Assistant:

LispPTR N_OP_ftimes2(LispPTR parg1, LispPTR parg2) {
  float arg1, arg2;
  float result;
  float *wordp;

  N_MakeFloat(parg1, arg1, parg2);
  N_MakeFloat(parg2, arg2, parg2);
  FPCLEAR;
  result = arg1 * arg2;
  if (FPTEST(result)) ERROR_EXIT(parg2);
  wordp = (float *)createcell68k(TYPE_FLOATP);
  *wordp = result;
  return (LAddrFromNative(wordp));
}